

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O0

void CB_EXPLORE_ADF::get_cost_ranges
               (vector<float,_std::allocator<float>_> *min_costs,
               vector<float,_std::allocator<float>_> *max_costs,float delta,cb_explore_adf *data,
               multi_learner *base,multi_ex *examples,bool min_only)

{
  value_type peVar1;
  value_type vVar2;
  bool bVar3;
  reference ppeVar4;
  action_score **ppaVar5;
  float *pfVar6;
  reference pvVar7;
  size_type sVar8;
  reference pvVar9;
  reference pvVar10;
  long in_RDX;
  vector<float,_std::allocator<float>_> *in_RSI;
  vector<float,_std::allocator<float>_> *in_RDI;
  vector<example_*,_std::allocator<example_*>_> *in_R8;
  byte in_R9B;
  size_t i;
  float w;
  float sens;
  example *ec;
  size_t a;
  float cmax;
  float cmin;
  action_score as;
  action_score *__end1_1;
  action_score *__begin1_1;
  value_type *__range1_1;
  example **ex;
  iterator __end1;
  iterator __begin1;
  multi_ex *__range1;
  vector<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_> *ex_costs;
  vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
  *ex_as;
  size_t num_actions;
  bool shared;
  vector<example_*,_std::allocator<example_*>_> *in_stack_ffffffffffffff08;
  __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
  *in_stack_ffffffffffffff10;
  example *in_stack_ffffffffffffff18;
  size_type sVar11;
  undefined4 in_stack_ffffffffffffff20;
  value_type in_stack_ffffffffffffff24;
  float in_stack_ffffffffffffff28;
  value_type in_stack_ffffffffffffff2c;
  value_type in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  float fVar12;
  size_type local_c0;
  float local_b8;
  float local_b4;
  float local_b0;
  float local_ac;
  value_type local_a8;
  ulong local_a0;
  value_type local_98;
  value_type local_94;
  action_score local_90;
  action_score *local_88;
  action_score *local_80;
  v_array<ACTION_SCORE::action_score> *local_78;
  reference local_70;
  example **local_68;
  __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_> local_60;
  vector<example_*,_std::allocator<example_*>_> *local_58;
  vector<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_> *local_50;
  vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
  *local_48;
  size_t local_40;
  byte local_32;
  byte local_31;
  vector<example_*,_std::allocator<example_*>_> *local_30;
  long local_20;
  vector<float,_std::allocator<float>_> *local_10;
  vector<float,_std::allocator<float>_> *local_8;
  
  local_31 = in_R9B & 1;
  local_30 = in_R8;
  local_20 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::vector<example_*,_std::allocator<example_*>_>::operator[](in_R8,0);
  local_32 = CB::ec_is_example_header
                       ((example *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  ppeVar4 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_30,0);
  local_40 = v_array<ACTION_SCORE::action_score>::size
                       ((v_array<ACTION_SCORE::action_score> *)&((*ppeVar4)->pred).scalars);
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  local_48 = (vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
              *)(local_20 + 0x220);
  local_50 = (vector<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_> *)
             (local_20 + 0x238);
  std::
  vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
  ::clear((vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
           *)0x35f1a1);
  std::vector<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>::clear
            ((vector<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_> *)0x35f1ae);
  local_58 = local_30;
  local_60._M_current =
       (example **)
       std::vector<example_*,_std::allocator<example_*>_>::begin(in_stack_ffffffffffffff08);
  local_68 = (example **)
             std::vector<example_*,_std::allocator<example_*>_>::end(in_stack_ffffffffffffff08);
  while (bVar3 = __gnu_cxx::operator!=
                           (in_stack_ffffffffffffff10,
                            (__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                             *)in_stack_ffffffffffffff08), bVar3) {
    local_70 = __gnu_cxx::
               __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
               operator*(&local_60);
    std::
    vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
    ::push_back((vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
                 *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                (value_type *)in_stack_ffffffffffffff18);
    std::vector<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>::push_back
              ((vector<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_> *)
               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (value_type *)in_stack_ffffffffffffff18);
    __gnu_cxx::__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
    operator++(&local_60);
  }
  local_78 = std::
             vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
             ::operator[](local_48,0);
  ppaVar5 = v_array<ACTION_SCORE::action_score>::begin(local_78);
  local_80 = *ppaVar5;
  ppaVar5 = v_array<ACTION_SCORE::action_score>::end(local_78);
  local_88 = *ppaVar5;
  for (; local_80 != local_88; local_80 = local_80 + 1) {
    local_90 = *local_80;
    fVar12 = local_90.score;
    ppeVar4 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                        (local_30,(ulong)((local_32 & 1) + local_90.action));
    ((*ppeVar4)->pred).multiclass = (uint32_t)fVar12;
  }
  local_94 = *(value_type *)(local_20 + 0x98);
  local_98 = *(value_type *)(local_20 + 0x9c);
  for (local_a0 = 0; local_a0 < local_40; local_a0 = local_a0 + 1) {
    ppeVar4 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                        (local_30,(local_32 & 1) + local_a0);
    local_a8 = *ppeVar4;
    (local_a8->l).simple.label = local_94 - 1.0;
    local_ac = LEARNER::learner<char,_std::vector<example_*,_std::allocator<example_*>_>_>::
               sensitivity((learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *)
                           CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                           in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10);
    local_b0 = 0.0;
    if ((((local_a8->pred).scalar < local_94) || (bVar3 = nanpattern(0.0), bVar3)) ||
       (bVar3 = infpattern(0.0), bVar3)) {
      vVar2 = local_94;
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](local_8,local_a0);
      *pvVar7 = vVar2;
    }
    else {
      local_b0 = binary_search(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                               in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
      local_b4 = -local_ac * local_b0 + (local_a8->pred).scalar;
      pfVar6 = std::max<float>(&local_b4,&local_94);
      fVar12 = *pfVar6;
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](local_8,local_a0);
      *pvVar7 = fVar12;
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](local_8,local_a0);
      if (local_98 < *pvVar7) {
        in_stack_ffffffffffffff30 = local_98;
        pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](local_8,local_a0);
        *pvVar7 = in_stack_ffffffffffffff30;
      }
    }
    if ((local_31 & 1) == 0) {
      (local_a8->l).simple.label = local_98 + 1.0;
      local_ac = LEARNER::learner<char,_std::vector<example_*,_std::allocator<example_*>_>_>::
                 sensitivity((learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *)
                             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                             in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10);
      if (((local_98 < (local_a8->pred).scalar) || (bVar3 = nanpattern(0.0), bVar3)) ||
         (bVar3 = infpattern(0.0), bVar3)) {
        in_stack_ffffffffffffff2c = local_98;
        pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](local_10,local_a0);
        *pvVar7 = in_stack_ffffffffffffff2c;
      }
      else {
        local_b0 = binary_search(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                                 in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
        local_b8 = local_ac * local_b0 + (local_a8->pred).scalar;
        pfVar6 = std::min<float>(&local_b8,&local_98);
        in_stack_ffffffffffffff28 = *pfVar6;
        pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](local_10,local_a0);
        *pvVar7 = in_stack_ffffffffffffff28;
        pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](local_10,local_a0);
        if (*pvVar7 < local_94) {
          in_stack_ffffffffffffff24 = local_94;
          pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](local_10,local_a0);
          *pvVar7 = in_stack_ffffffffffffff24;
        }
      }
    }
  }
  local_c0 = 0;
  while (sVar11 = local_c0,
        sVar8 = std::vector<example_*,_std::allocator<example_*>_>::size(local_30), sVar11 < sVar8)
  {
    pvVar9 = std::
             vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
             ::operator[](local_48,local_c0);
    ppeVar4 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_30,local_c0);
    peVar1 = *ppeVar4;
    (peVar1->pred).scalars._begin = (float *)pvVar9->_begin;
    (peVar1->pred).scalars._end = (float *)pvVar9->_end;
    (peVar1->pred).scalars.end_array = (float *)pvVar9->end_array;
    (peVar1->pred).scalars.erase_count = pvVar9->erase_count;
    pvVar10 = std::vector<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>::
              operator[](local_50,local_c0);
    ppeVar4 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_30,local_c0);
    peVar1 = *ppeVar4;
    (peVar1->l).multi = (label_t)pvVar10->_begin;
    (peVar1->l).cs.costs._end = (wclass *)pvVar10->_end;
    (peVar1->l).cs.costs.end_array = (wclass *)pvVar10->end_array;
    (peVar1->l).cs.costs.erase_count = pvVar10->erase_count;
    local_c0 = local_c0 + 1;
  }
  return;
}

Assistant:

void get_cost_ranges(std::vector<float>& min_costs, std::vector<float>& max_costs, float delta, cb_explore_adf& data,
    multi_learner& base, multi_ex& examples, bool min_only)
{
  const bool shared = CB::ec_is_example_header(*examples[0]);
  const size_t num_actions = examples[0]->pred.a_s.size();
  min_costs.resize(num_actions);
  max_costs.resize(num_actions);

  auto& ex_as = data.ex_as;
  auto& ex_costs = data.ex_costs;
  ex_as.clear();
  ex_costs.clear();

  // backup cb example data
  for (auto& ex : examples)
  {
    ex_as.push_back(ex->pred.a_s);
    ex_costs.push_back(ex->l.cb.costs);
  }

  // set regressor predictions
  for (auto as : ex_as[0])
  {
    examples[shared + as.action]->pred.scalar = as.score;
  }

  const float cmin = data.min_cb_cost;
  const float cmax = data.max_cb_cost;

  for (size_t a = 0; a < num_actions; ++a)
  {
    example* ec = examples[shared + a];
    ec->l.simple.label = cmin - 1;
    float sens = base.sensitivity(*ec);
    float w = 0;  // importance weight

    if (ec->pred.scalar < cmin || nanpattern(sens) || infpattern(sens))
      min_costs[a] = cmin;
    else
    {
      w = binary_search(ec->pred.scalar - cmin + 1, delta, sens);
      min_costs[a] = max(ec->pred.scalar - sens * w, cmin);
      if (min_costs[a] > cmax)
        min_costs[a] = cmax;
    }

    if (!min_only)
    {
      ec->l.simple.label = cmax + 1;
      sens = base.sensitivity(*ec);
      if (ec->pred.scalar > cmax || nanpattern(sens) || infpattern(sens))
      {
        max_costs[a] = cmax;
      }
      else
      {
        w = binary_search(cmax + 1 - ec->pred.scalar, delta, sens);
        max_costs[a] = min(ec->pred.scalar + sens * w, cmax);
        if (max_costs[a] < cmin)
          max_costs[a] = cmin;
      }
    }
  }

  // reset cb example data
  for (size_t i = 0; i < examples.size(); ++i)
  {
    examples[i]->pred.a_s = ex_as[i];
    examples[i]->l.cb.costs = ex_costs[i];
  }
}